

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_randomize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  mbedtls_mpi l;
  int local_5c;
  mbedtls_mpi local_48;
  
  sVar1 = grp->pbits;
  mbedtls_mpi_init(&local_48);
  local_5c = 0;
  do {
    iVar2 = mbedtls_mpi_fill_random(&local_48,sVar1 + 7 >> 3,f_rng,p_rng);
    while( true ) {
      if (iVar2 != 0) goto LAB_001108f9;
      iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&grp->P);
      if (iVar2 < 0) break;
      iVar2 = mbedtls_mpi_shift_r(&local_48,1);
    }
    if (local_5c == 0xb) {
      return -0x4d00;
    }
    local_5c = local_5c + 1;
    iVar2 = mbedtls_mpi_cmp_int(&local_48,1);
  } while (iVar2 < 1);
  iVar2 = mbedtls_mpi_mul_mpi(&P->X,&P->X,&local_48);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&P->X,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = mbedtls_mpi_mul_mod(grp,&P->Z,&P->Z,&local_48);
  }
LAB_001108f9:
  mbedtls_mpi_free(&local_48);
  return iVar2;
}

Assistant:

static int ecp_randomize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi l;
    size_t p_size;
    int count = 0;

#if defined(MBEDTLS_ECP_RANDOMIZE_MXZ_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_randomize_mxz( grp, P, f_rng, p_rng );
#endif /* MBEDTLS_ECP_RANDOMIZE_MXZ_ALT */

    p_size = ( grp->pbits + 7 ) / 8;
    mbedtls_mpi_init( &l );

    /* Generate l such that 1 < l < p */
    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng ) );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &P->X, &P->X, &l ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &P->Z, &P->Z, &l ) );

cleanup:
    mbedtls_mpi_free( &l );

    return( ret );
}